

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

xmlDocPtr xmlCtxtParseDocument(xmlParserCtxtPtr ctxt,xmlParserInputPtr input)

{
  int iVar1;
  xmlParserInputPtr pxVar2;
  xmlDocPtr pxVar3;
  
  if (input == (xmlParserInputPtr)0x0 || ctxt == (xmlParserCtxtPtr)0x0) {
    xmlFatalErr(ctxt,XML_ERR_ARGUMENT,(char *)0x0);
  }
  else {
    while (0 < ctxt->inputNr) {
      pxVar2 = xmlCtxtPopInput(ctxt);
      xmlFreeInputStream(pxVar2);
    }
    iVar1 = xmlCtxtPushInput(ctxt,input);
    if (-1 < iVar1) {
      xmlParseDocument(ctxt);
      pxVar3 = xmlCtxtGetDocument(ctxt);
      while (0 < ctxt->inputNr) {
        pxVar2 = xmlCtxtPopInput(ctxt);
        xmlFreeInputStream(pxVar2);
      }
      return pxVar3;
    }
  }
  xmlFreeInputStream(input);
  return (xmlDocPtr)0x0;
}

Assistant:

xmlDocPtr
xmlCtxtParseDocument(xmlParserCtxtPtr ctxt, xmlParserInputPtr input)
{
    xmlDocPtr ret = NULL;

    if ((ctxt == NULL) || (input == NULL)) {
        xmlFatalErr(ctxt, XML_ERR_ARGUMENT, NULL);
        xmlFreeInputStream(input);
        return(NULL);
    }

    /* assert(ctxt->inputNr == 0); */
    while (ctxt->inputNr > 0)
        xmlFreeInputStream(xmlCtxtPopInput(ctxt));

    if (xmlCtxtPushInput(ctxt, input) < 0) {
        xmlFreeInputStream(input);
        return(NULL);
    }

    xmlParseDocument(ctxt);

    ret = xmlCtxtGetDocument(ctxt);

    /* assert(ctxt->inputNr == 1); */
    while (ctxt->inputNr > 0)
        xmlFreeInputStream(xmlCtxtPopInput(ctxt));

    return(ret);
}